

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve_network.cpp
# Opt level: O2

void __thiscall polyscope::CurveNetwork::buildCustomUI(CurveNetwork *this)

{
  vec3 newVal;
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  
  sVar2 = render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::size
                    ((ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *)
                     &(this->super_QuantityStructure<polyscope::CurveNetwork>).field_0x428);
  sVar3 = render::ManagedBuffer<unsigned_int>::size(&this->edgeTailInds);
  ImGui::Text("nodes: %lld  edges: %lld",sVar2,sVar3);
  bVar1 = ImGui::ColorEdit3("Color",(float *)&(this->color).value,0x20);
  if (bVar1) {
    newVal.field_0 = (this->color).value.field_0;
    newVal.field_1 = (this->color).value.field_1;
    newVal.field_2 = (this->color).value.field_2;
    setColor(this,newVal);
  }
  ImGui::SameLine(0.0,-1.0);
  ImGui::PushItemWidth(100.0);
  bVar1 = ImGui::SliderFloat("Radius",&(this->radius).value.value,0.0,0.1,"%.5f",0x60);
  if (bVar1) {
    PersistentValue<polyscope::ScaledValue<float>_>::manuallyChanged(&this->radius);
    requestRedraw();
  }
  ImGui::PopItemWidth();
  return;
}

Assistant:

void CurveNetwork::buildCustomUI() {
  ImGui::Text("nodes: %lld  edges: %lld", static_cast<long long int>(nNodes()), static_cast<long long int>(nEdges()));
  if (ImGui::ColorEdit3("Color", &color.get()[0], ImGuiColorEditFlags_NoInputs)) {
    setColor(getColor());
  }
  ImGui::SameLine();
  ImGui::PushItemWidth(100);
  if (ImGui::SliderFloat("Radius", radius.get().getValuePtr(), 0.0, .1, "%.5f",
                         ImGuiSliderFlags_Logarithmic | ImGuiSliderFlags_NoRoundToFormat)) {
    radius.manuallyChanged();
    requestRedraw();
  }
  ImGui::PopItemWidth();
}